

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GLPositionCase::iterate(GLPositionCase *this)

{
  TextureFormat TVar1;
  deUint32 program;
  TestLog *pTVar2;
  RenderContext *context;
  Archive *archive;
  bool bVar3;
  int iVar4;
  deUint32 seed;
  undefined4 extraout_var;
  long lVar5;
  int in_R9D;
  TextureLevel reference;
  RandomViewport viewport;
  Surface pixels;
  undefined1 local_270 [8];
  void *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  int local_248;
  undefined1 local_240 [40];
  RandomViewport local_218;
  Surface local_208;
  TestLog *local_1f0;
  TextureFormat local_1e8;
  ConstPixelBufferAccess local_1e0;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  int local_190;
  VertexArrayPointer local_188 [2];
  ios_base local_140 [272];
  undefined4 extraout_var_00;
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar4 = (*context->_vptr_RenderContext[4])(context);
  seed = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_218,(RenderTarget *)CONCAT44(extraout_var,iVar4),0x100,0x100,seed);
  iVar4 = (*context->_vptr_RenderContext[3])(context);
  lVar5 = CONCAT44(extraout_var_00,iVar4);
  program = (((this->m_program).m_ptr)->m_program).m_program;
  (**(code **)(lVar5 + 0x1680))(program);
  (**(code **)(lVar5 + 0x1a00))(local_218.x,local_218.y,local_218.width,local_218.height);
  (**(code **)(lVar5 + 0xfd8))(0x8e72,3);
  (**(code **)(lVar5 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar5 + 0x188))(0x4000);
  local_1f0 = pTVar2;
  local_1b8 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0,"Note: input data for in_v_attr:\n",0x20);
  local_240._0_8_ = iterate::attributes;
  local_1e0.m_format = (TextureFormat)0x1c42c00;
  elemsStr<float_const*>
            ((string *)local_270,(Functional *)local_240,(float **)&local_1e0,
             (float **)&DAT_00000004,seed,in_R9D);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0,(char *)local_270,(long)local_268);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_270 != (undefined1  [8])&local_260) {
    operator_delete((void *)local_270,local_260._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
  std::ios_base::~ios_base(local_140);
  TVar1 = (TextureFormat)((long)local_240 + 0x10);
  local_240._0_8_ = TVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"in_v_attr","");
  local_270._0_4_ = A;
  local_268 = (void *)((long)&local_260 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_240._0_8_,(pointer)(local_240._8_8_ + local_240._0_8_));
  local_248 = 0;
  local_1b8._0_4_ = local_270._0_4_;
  local_1b0._M_p = (pointer)&local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,local_268,local_260._M_allocated_capacity + (long)local_268);
  local_190 = local_248;
  local_188[0].componentType = VTX_COMP_FLOAT;
  local_188[0].convert = VTX_COMP_CONVERT_NONE;
  local_188[0].numComponents = 4;
  local_188[0].numElements = 3;
  local_188[0].stride = 0;
  local_188[0].data = iterate::attributes;
  if (local_268 != (void *)((long)&local_260 + 8)) {
    operator_delete(local_268,local_260._8_8_ + 1);
  }
  if ((TextureFormat)local_240._0_8_ != TVar1) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  local_270._0_4_ = RGB;
  local_270._4_4_ = UNORM_INT8;
  local_268 = (void *)CONCAT44(local_268._4_4_,3);
  local_260._M_allocated_capacity = 0;
  glu::draw(context,program,1,(VertexArrayBinding *)local_1b8,(PrimitiveList *)local_270,
            (DrawUtilCallback *)0x0);
  getPixels(&local_208,context,local_218.x,local_218.y,local_218.width,local_218.height);
  archive = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_240,(this->m_referenceImagePath)._M_dataplus._M_p,
             (allocator<char> *)&local_1e0);
  getPNG((TextureLevel *)local_270,archive,(string *)local_240);
  if ((TextureFormat)local_240._0_8_ != TVar1) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_240,(TextureLevel *)local_270);
  local_1e8.order = RGBA;
  local_1e8.type = UNORM_INT8;
  if ((void *)local_208.m_pixels.m_cap != (void *)0x0) {
    local_208.m_pixels.m_cap = (size_t)local_208.m_pixels.m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_1e0,&local_1e8,local_208.m_width,local_208.m_height,1,
             (void *)local_208.m_pixels.m_cap);
  bVar3 = tcu::fuzzyCompare(local_1f0,"ImageComparison","Image Comparison",
                            (ConstPixelBufferAccess *)local_240,&local_1e0,0.02,COMPARE_LOG_RESULT);
  if (!bVar3) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_270);
  tcu::Surface::~Surface(&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_p != &local_1a0) {
    operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
  }
  if (bVar3) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

GLPositionCase::IterateResult GLPositionCase::iterate (void)
{
	TestLog&				log						= m_testCtx.getLog();
	const RenderContext&	renderCtx				= m_context.getRenderContext();
	const RandomViewport	viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&	gl						= renderCtx.getFunctions();
	const deUint32			programGL				= m_program->getProgram();

	static const float attributes[3*4] =
	{
		-0.8f, -0.7f, 0.1f, 0.7f,
		-0.5f,  0.4f, 0.2f, 0.5f,
		 0.3f,  0.2f, 0.3f, 0.45f
	};

	gl.useProgram(programGL);
	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, 3);

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	log << TestLog::Message << "Note: input data for in_v_attr:\n" << arrayStr(attributes, 4) << TestLog::EndMessage;

	{
		const glu::VertexArrayBinding bindings[] = { glu::va::Float("in_v_attr", 4, 3, 0, &attributes[0]) };
		glu::draw(renderCtx, programGL, DE_LENGTH_OF_ARRAY(bindings), &bindings[0], glu::pr::Patches(3));

		{
			const tcu::Surface			pixels		= getPixels(renderCtx, viewport);
			const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePath.c_str());
			const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), pixels.getAccess(), 0.02f, tcu::COMPARE_LOG_RESULT);

			if (!success)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}